

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

void __thiscall
glslang::TIntermediate::mergeModes(TIntermediate *this,TInfoSink *infoSink,TIntermediate *unit)

{
  EShLanguage EVar1;
  TLayoutGeometry TVar2;
  uint uVar3;
  int iVar4;
  pointer pTVar5;
  _Base_ptr p_Var6;
  int iVar7;
  int iVar8;
  pointer pTVar9;
  char *message;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  uint i;
  
  if (this->language != unit->language) {
    error(this,infoSink,"stages must match when linking into a single stage",EShLangCount);
  }
  if (this->source == EShSourceNone) {
    this->source = unit->source;
  }
  else if (this->source != unit->source) {
    error(this,infoSink,"can\'t link compilation units from different source languages",EShLangCount
         );
  }
  if (this->treeRoot == (TIntermNode *)0x0) {
    iVar7 = unit->version;
    this->profile = unit->profile;
    this->version = iVar7;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(this->requestedExtensions)._M_t,&(unit->requestedExtensions)._M_t);
  }
  else {
    if ((this->profile == EEsProfile) == (unit->profile == EEsProfile)) {
      if (unit->profile == ECompatibilityProfile) {
        this->profile = ECompatibilityProfile;
      }
    }
    else {
      error(this,infoSink,"Cannot cross link ES and desktop profiles",EShLangCount);
    }
    iVar7 = unit->version;
    if (unit->version < this->version) {
      iVar7 = this->version;
    }
    this->version = iVar7;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->requestedExtensions,
               (unit->requestedExtensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&(unit->requestedExtensions)._M_t._M_impl.super__Rb_tree_header);
  }
  uVar3 = (unit->spvVersion).spv;
  uVar11 = (this->spvVersion).spv;
  iVar7 = (this->spvVersion).vulkanGlsl;
  if (uVar3 < uVar11) {
    uVar3 = uVar11;
  }
  (this->spvVersion).spv = uVar3;
  iVar4 = (unit->spvVersion).vulkanGlsl;
  if (iVar4 < iVar7) {
    iVar4 = iVar7;
  }
  (this->spvVersion).vulkanGlsl = iVar4;
  iVar7 = (this->spvVersion).vulkan;
  iVar4 = (unit->spvVersion).vulkan;
  if (iVar4 < iVar7) {
    iVar4 = iVar7;
  }
  (this->spvVersion).vulkan = iVar4;
  iVar7 = (this->spvVersion).openGl;
  iVar4 = (unit->spvVersion).openGl;
  if (iVar4 < iVar7) {
    iVar4 = iVar7;
  }
  (this->spvVersion).openGl = iVar4;
  if ((unit->spvVersion).vulkanRelaxed == true) {
    (this->spvVersion).vulkanRelaxed = true;
  }
  this->numErrors = this->numErrors + unit->numErrors;
  iVar7 = this->numPushConstants;
  iVar4 = unit->numPushConstants;
  if (1 < iVar4 || 1 < iVar7) {
    error(this,infoSink,"Only one push_constant block is allowed per stage",EShLangCount);
    iVar7 = this->numPushConstants;
    iVar4 = unit->numPushConstants;
  }
  iVar8 = 1;
  if (iVar4 + iVar7 < 1) {
    iVar8 = iVar4 + iVar7;
  }
  this->numPushConstants = iVar8;
  iVar7 = unit->invocations;
  if (iVar7 != -1) {
    if (this->invocations == -1) {
      this->invocations = iVar7;
    }
    else if (this->invocations != iVar7) {
      error(this,infoSink,"number of invocations must match between compilation units",EShLangCount)
      ;
    }
  }
  iVar7 = unit->vertices;
  if (this->vertices == -1) {
    this->vertices = iVar7;
  }
  else if (this->vertices != iVar7 && iVar7 != -1) {
    EVar1 = this->language;
    if (EVar1 == EShLangTessControl) {
      message = "Contradictory layout vertices values";
    }
    else {
      if ((EVar1 != EShLangMesh) && (EVar1 != EShLangGeometry)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                      ,0x157,"void glslang::TIntermediate::mergeModes(TInfoSink &, TIntermediate &)"
                     );
      }
      message = "Contradictory layout max_vertices values";
    }
    error(this,infoSink,message,EShLangCount);
  }
  if (this->primitives == -1) {
    this->primitives = unit->primitives;
  }
  else if (this->primitives != unit->primitives) {
    if (this->language != EShLangMesh) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                    ,0x15f,"void glslang::TIntermediate::mergeModes(TInfoSink &, TIntermediate &)");
    }
    error(this,infoSink,"Contradictory layout max_primitives values",EShLangCount);
  }
  TVar2 = unit->inputPrimitive;
  if (this->inputPrimitive == ElgNone) {
    this->inputPrimitive = TVar2;
  }
  else if (this->inputPrimitive != TVar2 && TVar2 != ElgNone) {
    error(this,infoSink,"Contradictory input layout primitives",EShLangCount);
  }
  TVar2 = unit->outputPrimitive;
  if (this->outputPrimitive == ElgNone) {
    this->outputPrimitive = TVar2;
  }
  else if (this->outputPrimitive != TVar2 && TVar2 != ElgNone) {
    error(this,infoSink,"Contradictory output layout primitives",EShLangCount);
  }
  if ((this->originUpperLeft != unit->originUpperLeft) ||
     (this->pixelCenterInteger != unit->pixelCenterInteger)) {
    error(this,infoSink,"gl_FragCoord redeclarations must match across shaders",EShLangCount);
  }
  if (this->vertexSpacing == EvsNone) {
    this->vertexSpacing = unit->vertexSpacing;
  }
  else if (this->vertexSpacing != unit->vertexSpacing) {
    error(this,infoSink,"Contradictory input vertex spacing",EShLangCount);
  }
  if (this->vertexOrder == EvoNone) {
    this->vertexOrder = unit->vertexOrder;
  }
  else if (this->vertexOrder != unit->vertexOrder) {
    error(this,infoSink,"Contradictory triangle ordering",EShLangCount);
  }
  if (unit->pointMode == true) {
    this->pointMode = true;
  }
  for (lVar12 = 0x284; lVar12 != 0x287; lVar12 = lVar12 + 1) {
    if (*(char *)((long)&unit->language + lVar12) == '\x01') {
      if (*(char *)((long)&this->language + lVar12) == '\0') {
        *(undefined4 *)((long)this + lVar12 * 4 + -0x798) =
             *(undefined4 *)((long)unit + lVar12 * 4 + -0x798);
        *(undefined1 *)((long)&this->language + lVar12) = 1;
      }
      else if (*(int *)((long)this + lVar12 * 4 + -0x798) !=
               *(int *)((long)unit + lVar12 * 4 + -0x798)) {
        error(this,infoSink,"Contradictory local size",EShLangCount);
      }
    }
    iVar7 = *(int *)((long)this + lVar12 * 4 + -0x788);
    iVar4 = *(int *)((long)unit + lVar12 * 4 + -0x788);
    if (iVar7 == -1) {
      *(int *)((long)this + lVar12 * 4 + -0x788) = iVar4;
    }
    else if (iVar7 != iVar4) {
      error(this,infoSink,"Contradictory local size specialization ids",EShLangCount);
    }
  }
  if (unit->earlyFragmentTests != false) {
    this->earlyFragmentTests = true;
  }
  if (unit->postDepthCoverage == true) {
    this->postDepthCoverage = true;
  }
  if (unit->nonCoherentColorAttachmentReadEXT == true) {
    this->nonCoherentColorAttachmentReadEXT = true;
  }
  if (unit->nonCoherentDepthAttachmentReadEXT == true) {
    this->nonCoherentDepthAttachmentReadEXT = true;
  }
  if (unit->nonCoherentStencilAttachmentReadEXT == true) {
    this->nonCoherentStencilAttachmentReadEXT = true;
  }
  if (this->depthLayout == EldNone) {
    this->depthLayout = unit->depthLayout;
  }
  else if (this->depthLayout != unit->depthLayout) {
    error(this,infoSink,"Contradictory depth layouts",EShLangCount);
  }
  if (unit->depthReplacing == true) {
    this->depthReplacing = true;
  }
  if (unit->hlslFunctionality1 == true) {
    this->hlslFunctionality1 = true;
  }
  this->blendEquations = this->blendEquations | unit->blendEquations;
  if (unit->xfbMode == true) {
    this->xfbMode = true;
  }
  pTVar9 = (this->xfbBuffers).
           super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar12 = 0;
  for (uVar10 = 0;
      uVar10 < (ulong)(((long)(this->xfbBuffers).
                              super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar9) / 0x28);
      uVar10 = uVar10 + 1) {
    iVar7 = *(int *)((long)&pTVar9->stride + lVar12);
    pTVar5 = (unit->xfbBuffers).
             super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = *(int *)((long)&pTVar5->stride + lVar12);
    if (iVar7 == 0x3fff) {
      *(int *)((long)&pTVar9->stride + lVar12) = iVar4;
    }
    else if (iVar7 != iVar4) {
      error(this,infoSink,"Contradictory xfb_stride",EShLangCount);
      pTVar9 = (this->xfbBuffers).
               super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl
               .super__Vector_impl_data._M_start;
      pTVar5 = (unit->xfbBuffers).
               super__Vector_base<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>._M_impl
               .super__Vector_impl_data._M_start;
    }
    uVar3 = *(uint *)((long)&pTVar9->implicitStride + lVar12);
    uVar11 = *(uint *)((long)&pTVar5->implicitStride + lVar12);
    if (uVar11 < uVar3) {
      uVar11 = uVar3;
    }
    *(uint *)((long)&pTVar9->implicitStride + lVar12) = uVar11;
    if ((&pTVar5->contains64BitType)[lVar12] == true) {
      (&pTVar9->contains64BitType)[lVar12] = true;
    }
    if ((&pTVar5->contains32BitType)[lVar12] == true) {
      (&pTVar9->contains32BitType)[lVar12] = true;
    }
    if ((&pTVar5->contains16BitType)[lVar12] == true) {
      (&pTVar9->contains16BitType)[lVar12] = true;
    }
    lVar12 = lVar12 + 0x28;
  }
  if (unit->multiStream != false) {
    this->multiStream = true;
  }
  if (unit->layoutOverrideCoverage == true) {
    this->layoutOverrideCoverage = true;
  }
  if (unit->geoPassthroughEXT == true) {
    this->geoPassthroughEXT = true;
  }
  for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
    uVar3 = (unit->shiftBinding)._M_elems[lVar12];
    if (uVar3 != 0) {
      setShiftBinding(this,(TResourceType)lVar12,uVar3);
    }
  }
  for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
    for (p_Var6 = (unit->shiftBindingForSet)._M_elems[lVar12]._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var6 !=
        &(unit->shiftBindingForSet)._M_elems[lVar12]._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      setShiftBindingForSet
                (this,(TResourceType)lVar12,*(uint *)&p_Var6[1].field_0x4,p_Var6[1]._M_color);
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->resourceSetBinding,
             (this->resourceSetBinding).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (unit->resourceSetBinding).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (unit->resourceSetBinding).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (unit->autoMapBindings != false) {
    this->autoMapBindings = true;
  }
  if (unit->autoMapLocations == true) {
    this->autoMapLocations = true;
  }
  if (unit->invertY == true) {
    this->invertY = true;
  }
  if (unit->dxPositionW == true) {
    this->dxPositionW = true;
  }
  if (unit->debugInfo == true) {
    this->debugInfo = true;
  }
  if (unit->flattenUniformArrays == true) {
    this->flattenUniformArrays = true;
  }
  if (unit->useUnknownFormat == true) {
    this->useUnknownFormat = true;
  }
  if (unit->hlslOffsets == true) {
    this->hlslOffsets = true;
  }
  if (unit->useStorageBuffer == true) {
    this->useStorageBuffer = true;
  }
  if (unit->invariantAll == true) {
    this->invariantAll = true;
  }
  if (unit->hlslIoMapping == true) {
    this->hlslIoMapping = true;
  }
  if (unit->needToLegalize == true) {
    this->needToLegalize = true;
  }
  if (unit->binaryDoubleOutput == true) {
    this->binaryDoubleOutput = true;
  }
  if (unit->usePhysicalStorageBuffer == true) {
    this->usePhysicalStorageBuffer = true;
  }
  return;
}

Assistant:

void TIntermediate::mergeModes(TInfoSink& infoSink, TIntermediate& unit)
{
    if (language != unit.language)
        error(infoSink, "stages must match when linking into a single stage");

    if (getSource() == EShSourceNone)
        setSource(unit.getSource());
    if (getSource() != unit.getSource())
        error(infoSink, "can't link compilation units from different source languages");

    if (treeRoot == nullptr) {
        profile = unit.profile;
        version = unit.version;
        requestedExtensions = unit.requestedExtensions;
    } else {
        if ((isEsProfile()) != (unit.isEsProfile()))
            error(infoSink, "Cannot cross link ES and desktop profiles");
        else if (unit.profile == ECompatibilityProfile)
            profile = ECompatibilityProfile;
        version = std::max(version, unit.version);
        requestedExtensions.insert(unit.requestedExtensions.begin(), unit.requestedExtensions.end());
    }

    MERGE_MAX(spvVersion.spv);
    MERGE_MAX(spvVersion.vulkanGlsl);
    MERGE_MAX(spvVersion.vulkan);
    MERGE_MAX(spvVersion.openGl);
    MERGE_TRUE(spvVersion.vulkanRelaxed);

    numErrors += unit.getNumErrors();
    // Only one push_constant is allowed, mergeLinkerObjects() will ensure the push_constant
    // is the same for all units.
    if (numPushConstants > 1 || unit.numPushConstants > 1)
        error(infoSink, "Only one push_constant block is allowed per stage");
    numPushConstants = std::min(numPushConstants + unit.numPushConstants, 1);

    if (unit.invocations != TQualifier::layoutNotSet) {
        if (invocations == TQualifier::layoutNotSet)
            invocations = unit.invocations;
        else if (invocations != unit.invocations)
            error(infoSink, "number of invocations must match between compilation units");
    }

    if (vertices == TQualifier::layoutNotSet)
        vertices = unit.vertices;
    else if (unit.vertices != TQualifier::layoutNotSet && vertices != unit.vertices) {
        if (language == EShLangGeometry || language == EShLangMesh)
            error(infoSink, "Contradictory layout max_vertices values");
        else if (language == EShLangTessControl)
            error(infoSink, "Contradictory layout vertices values");
        else
            assert(0);
    }
    if (primitives == TQualifier::layoutNotSet)
        primitives = unit.primitives;
    else if (primitives != unit.primitives) {
        if (language == EShLangMesh)
            error(infoSink, "Contradictory layout max_primitives values");
        else
            assert(0);
    }

    if (inputPrimitive == ElgNone)
        inputPrimitive = unit.inputPrimitive;
    else if (unit.inputPrimitive != ElgNone && inputPrimitive != unit.inputPrimitive)
        error(infoSink, "Contradictory input layout primitives");

    if (outputPrimitive == ElgNone)
        outputPrimitive = unit.outputPrimitive;
    else if (unit.outputPrimitive != ElgNone && outputPrimitive != unit.outputPrimitive)
        error(infoSink, "Contradictory output layout primitives");

    if (originUpperLeft != unit.originUpperLeft || pixelCenterInteger != unit.pixelCenterInteger)
        error(infoSink, "gl_FragCoord redeclarations must match across shaders");

    if (vertexSpacing == EvsNone)
        vertexSpacing = unit.vertexSpacing;
    else if (vertexSpacing != unit.vertexSpacing)
        error(infoSink, "Contradictory input vertex spacing");

    if (vertexOrder == EvoNone)
        vertexOrder = unit.vertexOrder;
    else if (vertexOrder != unit.vertexOrder)
        error(infoSink, "Contradictory triangle ordering");

    MERGE_TRUE(pointMode);

    for (int i = 0; i < 3; ++i) {
        if (unit.localSizeNotDefault[i]) {
            if (!localSizeNotDefault[i]) {
                localSize[i] = unit.localSize[i];
                localSizeNotDefault[i] = true;
            }
            else if (localSize[i] != unit.localSize[i])
                error(infoSink, "Contradictory local size");
        }

        if (localSizeSpecId[i] == TQualifier::layoutNotSet)
            localSizeSpecId[i] = unit.localSizeSpecId[i];
        else if (localSizeSpecId[i] != unit.localSizeSpecId[i])
            error(infoSink, "Contradictory local size specialization ids");
    }

    MERGE_TRUE(earlyFragmentTests);
    MERGE_TRUE(postDepthCoverage);
    MERGE_TRUE(nonCoherentColorAttachmentReadEXT);
    MERGE_TRUE(nonCoherentDepthAttachmentReadEXT);
    MERGE_TRUE(nonCoherentStencilAttachmentReadEXT);

    if (depthLayout == EldNone)
        depthLayout = unit.depthLayout;
    else if (depthLayout != unit.depthLayout)
        error(infoSink, "Contradictory depth layouts");

    MERGE_TRUE(depthReplacing);
    MERGE_TRUE(hlslFunctionality1);

    blendEquations |= unit.blendEquations;

    MERGE_TRUE(xfbMode);

    for (size_t b = 0; b < xfbBuffers.size(); ++b) {
        if (xfbBuffers[b].stride == TQualifier::layoutXfbStrideEnd)
            xfbBuffers[b].stride = unit.xfbBuffers[b].stride;
        else if (xfbBuffers[b].stride != unit.xfbBuffers[b].stride)
            error(infoSink, "Contradictory xfb_stride");
        xfbBuffers[b].implicitStride = std::max(xfbBuffers[b].implicitStride, unit.xfbBuffers[b].implicitStride);
        if (unit.xfbBuffers[b].contains64BitType)
            xfbBuffers[b].contains64BitType = true;
        if (unit.xfbBuffers[b].contains32BitType)
            xfbBuffers[b].contains32BitType = true;
        if (unit.xfbBuffers[b].contains16BitType)
            xfbBuffers[b].contains16BitType = true;
        // TODO: 4.4 link: enhanced layouts: compare ranges
    }

    MERGE_TRUE(multiStream);
    MERGE_TRUE(layoutOverrideCoverage);
    MERGE_TRUE(geoPassthroughEXT);

    for (unsigned int i = 0; i < unit.shiftBinding.size(); ++i) {
        if (unit.shiftBinding[i] > 0)
            setShiftBinding((TResourceType)i, unit.shiftBinding[i]);
    }

    for (unsigned int i = 0; i < unit.shiftBindingForSet.size(); ++i) {
        for (auto it = unit.shiftBindingForSet[i].begin(); it != unit.shiftBindingForSet[i].end(); ++it)
            setShiftBindingForSet((TResourceType)i, it->second, it->first);
    }

    resourceSetBinding.insert(resourceSetBinding.end(), unit.resourceSetBinding.begin(), unit.resourceSetBinding.end());

    MERGE_TRUE(autoMapBindings);
    MERGE_TRUE(autoMapLocations);
    MERGE_TRUE(invertY);
    MERGE_TRUE(dxPositionW);
    MERGE_TRUE(debugInfo);
    MERGE_TRUE(flattenUniformArrays);
    MERGE_TRUE(useUnknownFormat);
    MERGE_TRUE(hlslOffsets);
    MERGE_TRUE(useStorageBuffer);
    MERGE_TRUE(invariantAll);
    MERGE_TRUE(hlslIoMapping);

    // TODO: sourceFile
    // TODO: sourceText
    // TODO: processes

    MERGE_TRUE(needToLegalize);
    MERGE_TRUE(binaryDoubleOutput);
    MERGE_TRUE(usePhysicalStorageBuffer);
}